

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  Result RVar4;
  long lVar5;
  string name;
  Location loc;
  string field_name;
  string module_name;
  undefined1 local_118 [32];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string local_d8;
  long *local_b8;
  size_type sStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  long lStack_a0;
  long *local_98;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_118,this);
  local_a8.offset = local_118._16_8_;
  lStack_a0 = local_118._24_8_;
  local_b8 = (long *)local_118._0_8_;
  sStack_b0 = local_118._8_8_;
  CheckImportOrdering(this,module);
  RVar2 = Expect(this,Import);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  RVar2 = ParseQuotedText(this,&local_50);
  RVar4.enum_ = Error;
  if (((RVar2.enum_ == Error) || (RVar2 = ParseQuotedText(this,&local_70), RVar2.enum_ == Error)) ||
     (RVar2 = Expect(this,Lpar), RVar2.enum_ == Error)) goto LAB_00163996;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  TVar3 = Peek(this,0);
  if ((int)TVar3 < 0x13) {
    if (TVar3 == Event) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::EventImport,std::__cxx11::string&>((wabt *)local_118,&local_d8);
      RVar2 = ParseTypeUseOpt(this,(FuncDeclaration *)(local_118._0_8_ + 0x70));
      local_98 = (long *)local_118._0_8_;
      if (RVar2.enum_ == Error) goto LAB_00163972;
      RVar2 = ParseUnboundFuncSignature(this,(FuncSignature *)(local_118._0_8_ + 0xc0));
      goto LAB_00163952;
    }
    if (TVar3 == Func) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::FuncImport,std::__cxx11::string&>((wabt *)&local_98,&local_d8);
      bVar1 = PeekMatchLpar(this,Type);
      if (!bVar1) {
        RVar2 = ParseFuncSignature(this,(FuncSignature *)(local_98 + 0x18),
                                   (BindingHash *)(local_98 + 0x21));
        if (RVar2.enum_ != Error) {
          local_118._0_8_ = local_118 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"param","");
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"result","");
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                     (string *)local_118,&local_d8);
          lVar5 = 0;
          RVar2 = ErrorIfLpar(this,&local_88,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
          do {
            if (local_e8 + lVar5 != *(undefined1 **)((long)local_f8 + lVar5)) {
              operator_delete(*(undefined1 **)((long)local_f8 + lVar5));
            }
            lVar5 = lVar5 + -0x20;
          } while (lVar5 != -0x40);
          if (RVar2.enum_ != Error) goto LAB_00163bd6;
        }
        goto LAB_00163972;
      }
      *(undefined1 *)(local_98 + 0xe) = 1;
      RVar2 = ParseTypeUseOpt(this,(FuncDeclaration *)(local_98 + 0xe));
      if (RVar2.enum_ == Error) goto LAB_00163972;
LAB_00163bd6:
      RVar2 = Expect(this,Rpar);
      if (RVar2.enum_ == Error) goto LAB_00163972;
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      goto LAB_00163a61;
    }
LAB_001639ce:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"an external kind","");
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               (string *)local_118);
    RVar4 = ErrorExpected(this,&local_88,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  else {
    if (TVar3 == Global) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::GlobalImport,std::__cxx11::string&>((wabt *)local_118,&local_d8);
      RVar2 = ParseGlobalType(this,(Global *)(local_118._0_8_ + 0x50));
    }
    else if (TVar3 == Memory) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::MemoryImport,std::__cxx11::string&>((wabt *)local_118,&local_d8);
      RVar2 = ParseLimits(this,(Limits *)(local_118._0_8_ + 0x70));
    }
    else {
      if (TVar3 != Table) goto LAB_001639ce;
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::TableImport,std::__cxx11::string&>((wabt *)local_118,&local_d8);
      RVar2 = ParseLimits(this,(Limits *)(local_118._0_8_ + 0x70));
      local_98 = (long *)local_118._0_8_;
      if (RVar2.enum_ == Error) goto LAB_00163972;
      RVar2 = ParseRefType(this,(Type *)(local_118._0_8_ + 0x88));
    }
LAB_00163952:
    local_98 = (long *)local_118._0_8_;
    if ((RVar2.enum_ == Error) ||
       (RVar2 = Expect(this,Rpar), local_98 = (long *)local_118._0_8_, RVar2.enum_ == Error)) {
LAB_00163972:
      if (local_98 != (long *)0x0) {
        (**(code **)(*local_98 + 8))();
      }
      RVar4.enum_ = Error;
    }
    else {
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      local_98 = (long *)local_118._0_8_;
LAB_00163a61:
      *(long *)((long)&((ImportModuleField *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 8) = 0;
      *(long *)((long)&((ImportModuleField *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x10) = 0;
      *(size_t *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x28) = local_a8.offset;
      *(long *)((long)&((ImportModuleField *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x30) = lStack_a0;
      *(long **)((long)&((ImportModuleField *)
                        local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                        super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x18) = local_b8;
      *(size_type *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x20) = sStack_b0;
      *(undefined4 *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x38) = 2;
      *(undefined ***)
       &((ImportModuleField *)
        local_90._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2> = &PTR__ImportModuleField_001bc2e0;
      ((ImportModuleField *)
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import =
           (unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>)local_98;
      std::__cxx11::string::_M_assign((string *)(local_98 + 1));
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 0x28));
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_90);
      if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           )local_90._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
          (ImportModuleField *)0x0) {
        (**(code **)(*(long *)local_90._M_t.
                              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl
                    + 8))();
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            )0x0;
      RVar2 = Expect(this,Rpar);
      RVar4.enum_ = (Enum)(RVar2.enum_ == Error);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
LAB_00163996:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<FuncImport>(name);
      if (PeekMatchLpar(TokenType::Type)) {
        import->func.decl.has_func_type = true;
        CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
        EXPECT(Rpar);
      } else {
        CHECK_RESULT(
            ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
        CHECK_RESULT(ErrorIfLpar({"param", "result"}));
        EXPECT(Rpar);
      }
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<TableImport>(name);
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<MemoryImport>(name);
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Event: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<EventImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->event.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->event.decl.sig));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}